

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void eig2t(double *A,int stride)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double at22;
  double at21;
  double at12;
  double at11;
  double t;
  double t1;
  double cs;
  double s2;
  double c2;
  double s;
  double c;
  double a22;
  double a21;
  double a12;
  double a11;
  int N;
  int stride_local;
  double *A_local;
  
  dVar1 = *A;
  dVar2 = A[1];
  dVar3 = A[stride];
  dVar4 = A[stride + 1];
  if ((dVar2 + dVar3 != 0.0) || (NAN(dVar2 + dVar3))) {
    dVar6 = (dVar1 - dVar4) / (dVar2 + dVar3);
    dVar5 = sqrt(dVar6 * dVar6 + 1.0);
    dVar6 = dVar6 / (dVar5 + 1.0);
    dVar5 = sqrt(dVar6 * dVar6 + 1.0);
    s = 1.0 / dVar5;
    c2 = s * dVar6;
  }
  else {
    dVar5 = sqrt(2.0);
    c2 = 1.0 / dVar5;
    s = c2;
  }
  dVar5 = s * s;
  dVar6 = c2 * c2;
  dVar7 = s * c2;
  *A = -dVar7 * (dVar2 + dVar3) + dVar5 * dVar1 + dVar6 * dVar4;
  A[1] = dVar7 * (dVar1 - dVar4) + dVar5 * dVar2 + -(dVar6 * dVar3);
  A[stride] = dVar7 * (dVar1 - dVar4) + dVar5 * dVar3 + -(dVar6 * dVar2);
  A[stride + 1] = dVar7 * (dVar2 + dVar3) + dVar5 * dVar4 + dVar6 * dVar1;
  return;
}

Assistant:

static void eig2t(double *A, int stride) {
	int N;
	double a11,a12,a21,a22,c,s,c2,s2,cs,t1,t,at11,at12,at21,at22;
	N = stride;
	
	a11 = A[0];
	a12 = A[1];
	a21 = A[N];
	a22 = A[N+1];
	
	if ( (a12 + a21) == 0) {
		c = 1./sqrt(2.0);
		s = c;
	} else {
		t1 = (a11 - a22) / (a12 + a21);
		t = t1 /(1. + sqrt(1+t1*t1));
		c = 1./sqrt(1 + t*t);
		s = c*t;
	}
	
	c2 = c*c;
	s2 = s*s;
	cs = c*s;

	at11 = c2 * a11 + s2 * a22 - cs * (a12 + a21);
	at12 = c2 * a12 - s2 * a21 + cs * (a11 - a22);
	at21 = c2 * a21 - s2 * a12 + cs * (a11 - a22);
	at22 = c2 * a22 + s2 * a11 + cs * (a12 + a21);
	A[0] = at11;
	A[1] = at12;
	A[N] = at21;
	A[N+1] = at22;

}